

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O2

void QComboBoxDelegate::setSeparator(QAbstractItemModel *model,QModelIndex *index)

{
  uint uVar1;
  storage_type *psVar2;
  QModelIndex *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QArrayDataPointer<char16_t> local_60;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (storage_type *)QByteArrayView::lengthHelperCharArray("separator",10);
  QVar5.m_data = psVar2;
  QVar5.m_size = (qsizetype)&local_60;
  QString::fromLatin1(QVar5);
  ::QVariant::QVariant(&local_48,(QString *)&local_60);
  (**(code **)(*(long *)model + 0x98))(model,index,&local_48,0xc);
  ::QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  pQVar3 = (QModelIndex *)
           QtPrivate::qobject_cast_helper<QStandardItemModel*,QObject>((QObject *)model);
  if (pQVar3 != (QModelIndex *)0x0) {
    lVar4 = QStandardItemModel::itemFromIndex(pQVar3);
    if (lVar4 != 0) {
      uVar1 = QStandardItem::flags();
      QStandardItem::setFlags(lVar4,uVar1 & 0xffffffde);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void setSeparator(QAbstractItemModel *model, const QModelIndex &index) {
        model->setData(index, QString::fromLatin1("separator"), Qt::AccessibleDescriptionRole);
        if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model))
            if (QStandardItem *item = m->itemFromIndex(index))
                item->setFlags(item->flags() & ~(Qt::ItemIsSelectable|Qt::ItemIsEnabled));
    }